

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWLookat.h
# Opt level: O0

int __thiscall
COLLADAFW::Lookat::clone(Lookat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  Lookat *in_stack_ffffffffffffffe8;
  Lookat *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x70);
  Lookat(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return (int)pvVar1;
}

Assistant:

virtual Lookat* clone() const { return new Lookat(*this); }